

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

void __thiscall CodeGen::generate(CodeGen *this,ValidSchema *schema)

{
  bool bVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  NodePtr *n;
  ostream *poVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  pointer __rhs;
  pointer pPVar9;
  string sn;
  string h;
  long *local_c0;
  long local_b0;
  long lStack_a8;
  string local_a0;
  NodePtr *local_80;
  CodeGen *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,
             "/**\n * Licensed to the Apache Software Foundation (ASF) under one\n * or more contributor license agreements.  See the NOTICE file\n * distributed with this work for additional information\n * regarding copyright ownership.  The ASF licenses this file\n * to you under the Apache License, Version 2.0 (the\n * \"License\"); you may not use this file except in compliance\n * with the License.  You may obtain a copy of the License at\n *\n *     http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n */\n\n\n"
             ,0x329);
  sVar2 = (this->guardString_)._M_string_length;
  if (sVar2 == 0) {
    guard_abi_cxx11_(&local_a0,this);
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    pcVar3 = (this->guardString_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,pcVar3,pcVar3 + sVar2);
  }
  poVar5 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#ifndef ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  poVar5 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#define ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n\n",3);
  poVar5 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include <sstream>\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include \"boost/any.hpp\"\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include \"",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->includePrefix_)._M_dataplus._M_p,
                      (this->includePrefix_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Specific.hh\"\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include \"",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->includePrefix_)._M_dataplus._M_p,
                      (this->includePrefix_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Encoder.hh\"\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include \"",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->includePrefix_)._M_dataplus._M_p,
                      (this->includePrefix_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Decoder.hh\"\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if ((this->ns_)._M_string_length != 0) {
    poVar5 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"namespace ",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->ns_)._M_dataplus._M_p,(this->ns_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
    this->inNamespace_ = true;
  }
  generateType_abi_cxx11_(&local_50,this,&schema->root_);
  local_80 = &schema->root_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __rhs = (this->pendingGettersAndSetters).
          super__Vector_base<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__rhs != (this->pendingGettersAndSetters).
               super__Vector_base<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>._M_impl
               .super__Vector_impl_data._M_finish) {
    local_78 = this;
    do {
      poVar5 = local_78->os_;
      std::operator+(&local_70," ",&__rhs->structName);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_b0 = *plVar8;
        lStack_a8 = plVar6[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar8;
        local_c0 = (long *)*plVar6;
      }
      lVar4 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"inline\n",7);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(__rhs->type)._M_dataplus._M_p,(__rhs->type)._M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_c0,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"get_",4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(__rhs->name)._M_dataplus._M_p,(__rhs->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() const {\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    if (idx_ != ",0x10);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {\n",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"        throw avro::Exception(\"Invalid type for ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"union\");\n",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    }\n",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    return boost::any_cast<",0x1b);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(__rhs->type)._M_dataplus._M_p,(__rhs->type)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," >(value_);\n",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"inline\n",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_c0,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"set_",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(__rhs->name)._M_dataplus._M_p,(__rhs->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(const ",7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(__rhs->type)._M_dataplus._M_p,(__rhs->type)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"& v) {\n",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    idx_ = ",0xb);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    value_ = v;\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n\n",3);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      __rhs = __rhs + 1;
      this = local_78;
    } while (__rhs != (local_78->pendingGettersAndSetters).
                      super__Vector_base<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  pPVar9 = (this->pendingConstructors).
           super__Vector_base<PendingConstructor,_std::allocator<PendingConstructor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar9 != (this->pendingConstructors).
                super__Vector_base<PendingConstructor,_std::allocator<PendingConstructor>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      poVar5 = this->os_;
      bVar1 = pPVar9->initMember;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"inline ",7);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pPVar9->structName)._M_dataplus._M_p,
                          (pPVar9->structName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"::",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(pPVar9->structName)._M_dataplus._M_p,
                          (pPVar9->structName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() : idx_(0)",0xc);
      if (bVar1 != false) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", value_(",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pPVar9->memberName)._M_dataplus._M_p,
                            (pPVar9->memberName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"())",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," { }\n",5);
      pPVar9 = pPVar9 + 1;
    } while (pPVar9 != (this->pendingConstructors).
                       super__Vector_base<PendingConstructor,_std::allocator<PendingConstructor>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  n = local_80;
  if ((this->ns_)._M_string_length != 0) {
    this->inNamespace_ = false;
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"}\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"namespace avro {\n",0x11);
  this->unionNumber_ = 0;
  generateTraits(this,n);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"#endif\n",7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CodeGen::generate(const ValidSchema& schema)
{
    emitCopyright();

    string h = guardString_.empty() ? guard() : guardString_;

    os_ << "#ifndef " << h << "\n";
    os_ << "#define " << h << "\n\n\n";

    os_ << "#include <sstream>\n"
        << "#include \"boost/any.hpp\"\n"
        << "#include \"" << includePrefix_ << "Specific.hh\"\n"
        << "#include \"" << includePrefix_ << "Encoder.hh\"\n"
        << "#include \"" << includePrefix_ << "Decoder.hh\"\n"
        << "\n";

    if (! ns_.empty()) {
        os_ << "namespace " << ns_ << " {\n";
        inNamespace_ = true;
    }

    const NodePtr& root = schema.root();
    generateType(root);

    for (vector<PendingSetterGetter>::const_iterator it =
        pendingGettersAndSetters.begin();
        it != pendingGettersAndSetters.end(); ++it) {
        generateGetterAndSetter(os_, it->structName, it->type, it->name,
            it->idx);
    }

    for (vector<PendingConstructor>::const_iterator it =
        pendingConstructors.begin();
        it != pendingConstructors.end(); ++it) {
        generateConstructor(os_, it->structName,
            it->initMember, it->memberName);
    }

    if (! ns_.empty()) {
        inNamespace_ = false;
        os_ << "}\n";
    }

    os_ << "namespace avro {\n";

    unionNumber_ = 0;

    generateTraits(root);

    os_ << "}\n";

    os_ << "#endif\n";
    os_.flush();

}